

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterReader.cpp
# Opt level: O1

double __thiscall ParameterReader::getVal(ParameterReader *this,string *name,double defaultValue)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  string local_40;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
  lVar2 = _find(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (lVar2 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ParameterReader::getVal error: parameter with name ",0x33);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," not found.",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"using defaultValue: ",0x14);
    poVar3 = std::ostream::_M_insert<double>(defaultValue);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else {
    defaultValue = (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar2];
  }
  return defaultValue;
}

Assistant:

double ParameterReader::getVal(string name, double defaultValue) const {
    long idx = _find(name);
    if (idx != -1) {
        return values[idx];
    } else {
        cout << "ParameterReader::getVal error: parameter with name " << name
             << " not found." << endl;
        cout << "using defaultValue: " << defaultValue << endl;
        return (defaultValue);
    }
}